

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numsys.cpp
# Opt level: O1

void __thiscall icu_63::NumberingSystem::NumberingSystem(NumberingSystem *this)

{
  UnicodeString defaultDigits;
  ConstChar16Ptr local_70;
  char16_t *local_68;
  UnicodeString local_58;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__NumberingSystem_003d5e98;
  (this->desc).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e6fd8;
  (this->desc).fUnion.fStackFields.fLengthAndFlags = 2;
  this->radix = 10;
  this->algorithmic = '\0';
  local_70.p_ = L"0123456789";
  UnicodeString::UnicodeString(&local_58,'\x01',&local_70,-1);
  local_68 = local_70.p_;
  UnicodeString::copyFrom(&this->desc,&local_58,'\0');
  builtin_strncpy(this->name,"latn",5);
  UnicodeString::~UnicodeString(&local_58);
  return;
}

Assistant:

NumberingSystem::NumberingSystem() {
     radix = 10;
     algorithmic = FALSE;
     UnicodeString defaultDigits = DEFAULT_DIGITS;
     desc.setTo(defaultDigits);
     uprv_strcpy(name,gLatn);
}